

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lottieitem.cpp
# Opt level: O3

bool __thiscall
rlottie::internal::renderer::Group::resolveKeyPath
          (Group *this,LOTKeyPath *keyPath,uint32_t depth,LOTVariant *value)

{
  Filter<rlottie::internal::model::Group> *this_00;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  Property PVar2;
  pointer ppOVar3;
  bool bVar4;
  int iVar5;
  uint32_t uVar6;
  FilterData *this_01;
  Group *pGVar7;
  Group *pGVar8;
  Object **child;
  pointer ppOVar9;
  allocator local_bd;
  uint32_t local_bc;
  string local_b8;
  Group *local_98;
  string local_90;
  string local_70;
  string local_50;
  
  pGVar7 = (this->mModel).super_FilterBase<rlottie::internal::model::Group>.model_;
  pGVar8 = (Group *)name()::TAG;
  if ((pGVar7 != (Group *)0x0) &&
     (pGVar8 = pGVar7,
     (undefined1  [16])
     ((undefined1  [16])(pGVar7->super_Object).field_0 & (undefined1  [16])0x400000000000000) ==
     (undefined1  [16])0x0)) {
    pGVar8 = (Group *)(pGVar7->super_Object).field_0.mPtr;
  }
  local_bc = depth;
  std::__cxx11::string::string((string *)&local_b8,(char *)pGVar8,&local_bd);
  iVar5 = std::__cxx11::string::compare((char *)&local_b8);
  paVar1 = &local_b8.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b8._M_dataplus._M_p != paVar1) {
    operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
  }
  this_00 = &this->mModel;
  local_98 = this;
  if (iVar5 != 0) {
    pGVar7 = (this_00->super_FilterBase<rlottie::internal::model::Group>).model_;
    if ((undefined1  [16])
        ((undefined1  [16])(pGVar7->super_Object).field_0 & (undefined1  [16])0x400000000000000) ==
        (undefined1  [16])0x0) {
      pGVar7 = (Group *)(pGVar7->super_Object).field_0.mPtr;
    }
    std::__cxx11::string::string((string *)&local_b8,(char *)pGVar7,&local_bd);
    bVar4 = LOTKeyPath::matches(keyPath,&local_b8,local_bc);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b8._M_dataplus._M_p != paVar1) {
      operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
    }
    if (!bVar4) {
      return false;
    }
    pGVar7 = (this_00->super_FilterBase<rlottie::internal::model::Group>).model_;
    if ((undefined1  [16])
        ((undefined1  [16])(pGVar7->super_Object).field_0 & (undefined1  [16])0x400000000000000) ==
        (undefined1  [16])0x0) {
      pGVar7 = (Group *)(pGVar7->super_Object).field_0.mPtr;
    }
    std::__cxx11::string::string((string *)&local_b8,(char *)pGVar7,&local_bd);
    iVar5 = std::__cxx11::string::compare((char *)&local_b8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b8._M_dataplus._M_p != paVar1) {
      operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
    }
    if (iVar5 != 0) {
      pGVar7 = (this_00->super_FilterBase<rlottie::internal::model::Group>).model_;
      if ((undefined1  [16])
          ((undefined1  [16])(pGVar7->super_Object).field_0 & (undefined1  [16])0x400000000000000)
          == (undefined1  [16])0x0) {
        pGVar7 = (Group *)(pGVar7->super_Object).field_0.mPtr;
      }
      std::__cxx11::string::string((string *)&local_90,(char *)pGVar7,(allocator *)&local_b8);
      bVar4 = LOTKeyPath::fullyResolvesTo(keyPath,&local_90,local_bc);
      if (bVar4) {
        PVar2 = value->mPropery;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_90._M_dataplus._M_p != &local_90.field_2) {
          operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
        }
        if (PVar2 - TrAnchor < 5) {
          this_01 = model::FilterBase<rlottie::internal::model::Group>::filter
                              (&this_00->super_FilterBase<rlottie::internal::model::Group>);
          model::FilterData::addValue(this_01,value);
        }
      }
      else if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)local_90._M_dataplus._M_p != &local_90.field_2) {
        operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
      }
    }
  }
  pGVar7 = (this_00->super_FilterBase<rlottie::internal::model::Group>).model_;
  pGVar8 = (Group *)name()::TAG;
  if ((pGVar7 != (Group *)0x0) &&
     (pGVar8 = pGVar7,
     (undefined1  [16])
     ((undefined1  [16])(pGVar7->super_Object).field_0 & (undefined1  [16])0x400000000000000) ==
     (undefined1  [16])0x0)) {
    pGVar8 = (Group *)(pGVar7->super_Object).field_0.mPtr;
  }
  std::__cxx11::string::string((string *)&local_50,(char *)pGVar8,(allocator *)&local_b8);
  bVar4 = LOTKeyPath::propagate(keyPath,&local_50,local_bc);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  if (bVar4) {
    pGVar7 = (this_00->super_FilterBase<rlottie::internal::model::Group>).model_;
    pGVar8 = (Group *)name()::TAG;
    if ((pGVar7 != (Group *)0x0) &&
       (pGVar8 = pGVar7,
       (undefined1  [16])
       ((undefined1  [16])(pGVar7->super_Object).field_0 & (undefined1  [16])0x400000000000000) ==
       (undefined1  [16])0x0)) {
      pGVar8 = (Group *)(pGVar7->super_Object).field_0.mPtr;
    }
    std::__cxx11::string::string((string *)&local_70,(char *)pGVar8,(allocator *)&local_b8);
    uVar6 = LOTKeyPath::nextDepth(keyPath,&local_70,local_bc);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p != &local_70.field_2) {
      operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
    }
    ppOVar3 = (local_98->mContents).
              super__Vector_base<rlottie::internal::renderer::Object_*,_std::allocator<rlottie::internal::renderer::Object_*>_>
              ._M_impl.super__Vector_impl_data._M_finish;
    for (ppOVar9 = (local_98->mContents).
                   super__Vector_base<rlottie::internal::renderer::Object_*,_std::allocator<rlottie::internal::renderer::Object_*>_>
                   ._M_impl.super__Vector_impl_data._M_start; ppOVar9 != ppOVar3;
        ppOVar9 = ppOVar9 + 1) {
      (*(*ppOVar9)->_vptr_Object[4])(*ppOVar9,keyPath,(ulong)uVar6,value);
    }
  }
  return true;
}

Assistant:

bool renderer::Group::resolveKeyPath(LOTKeyPath &keyPath, uint32_t depth,
                                     LOTVariant &value)
{
    if (!keyPath.skip(name())) {
        if (!keyPath.matches(mModel.name(), depth)) {
            return false;
        }

        if (!keyPath.skip(mModel.name())) {
            if (keyPath.fullyResolvesTo(mModel.name(), depth) &&
                transformProp(value.property())) {
                mModel.filter()->addValue(value);
            }
        }
    }

    if (keyPath.propagate(name(), depth)) {
        uint32_t newDepth = keyPath.nextDepth(name(), depth);
        for (auto &child : mContents) {
            child->resolveKeyPath(keyPath, newDepth, value);
        }
    }
    return true;
}